

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmDefinitions::ClosureKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmDefinitions *this,StackIter begin,StackIter end)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  PointerType pcVar4;
  __node_base *p_Var5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  iterator other;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bound;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  iterator local_40;
  
  local_40.Position = (PositionType)begin.Tree;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40.Tree = (cmLinkedTree<cmDefinitions> *)this;
  while( true ) {
    other.Position = (PositionType)end.Tree;
    other.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
    bVar3 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_40,other);
    if (!bVar3) break;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,
              ((long)pbVar2 - (long)pbVar1 >> 5) + (pcVar4->Map)._M_h._M_element_count);
    pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
    p_Var5 = &(pcVar4->Map)._M_h._M_before_begin;
    while( true ) {
      p_Var5 = p_Var5->_M_nxt;
      cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
      if (p_Var5 == (__node_base *)0x0) break;
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var5 + 1));
      if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (*(char *)&p_Var5[9]._M_nxt == '\x01')) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var5 + 1));
      }
    }
    cmLinkedTree<cmDefinitions>::iterator::operator++(&local_40);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmDefinitions::ClosureKeys(StackIter begin,
                                                    StackIter end)
{
  std::set<std::string> bound;
  std::vector<std::string> defined;

  for (StackIter it = begin; it != end; ++it) {
    defined.reserve(defined.size() + it->Map.size());
    for (MapType::const_iterator mi = it->Map.begin(); mi != it->Map.end();
         ++mi) {
      // Use this key if it is not already set or unset.
      if (bound.insert(mi->first).second && mi->second.Exists) {
        defined.push_back(mi->first);
      }
    }
  }

  return defined;
}